

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataWriterClient.cpp
# Opt level: O0

void __thiscall DataWriterClient::openClient(DataWriterClient *this)

{
  undefined4 __fd;
  int iVar1;
  char *pcVar2;
  hostent *phVar3;
  reference pvVar4;
  size_type sVar5;
  mapped_type *pmVar6;
  mapped_type *pmVar7;
  ulong uVar8;
  char *__src;
  size_t __n;
  string_conflict local_670;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_650;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_630;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_610;
  undefined1 local_5f0 [8];
  string_conflict setCommand;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_5b0;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_578;
  undefined1 local_540 [8];
  string_conflict bindStr;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  local_518;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_4e0;
  mapped_type local_4a8;
  double varValue;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_490;
  undefined1 local_478 [8];
  string_conflict varName;
  char buffer_ip [26];
  char buffer [1024];
  hostent *server;
  sockaddr_in serv_addr;
  int portno;
  int sockfd;
  DataWriterClient *this_local;
  
  memset(&server,0,0x10);
  serv_addr.sin_zero._0_4_ = this->port;
  serv_addr.sin_zero._4_4_ = socket(2,1,0);
  if ((int)serv_addr.sin_zero._4_4_ < 0) {
    perror("ERROR opening socket");
  }
  else {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    strcpy(varName.field_2._M_local_buf + 8,pcVar2);
    phVar3 = gethostbyname(varName.field_2._M_local_buf + 8);
    if (phVar3 == (hostent *)0x0) {
      fprintf(_stderr,"ERROR, no such host\n");
    }
    else {
      memset(&server,0,0x10);
      server._0_2_ = 2;
      memmove((void *)((long)&server + 4),*phVar3->h_addr_list,(long)phVar3->h_length);
      server._2_2_ = htons(serv_addr.sin_zero._0_2_);
      iVar1 = connect(serv_addr.sin_zero._4_4_,(sockaddr *)&server,0x10);
      if (-1 < iVar1) {
        do {
          while (((this->dataVars->isChanged ^ 0xffU) & 1) != 0) {
            usleep(5000);
          }
          DataVars::getLastChanged_abi_cxx11_(&local_490,this->dataVars);
          pvVar4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::at(&local_490,0);
          std::__cxx11::string::string((string *)local_478,(string *)pvVar4);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_490);
          DataVars::deleteFirstElementFromLastChanged(this->dataVars);
          local_4a8 = 0.0;
          DataBinds::getVarToNameInSimulator_abi_cxx11_(&local_4e0,this->dataBinds);
          sVar5 = std::
                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::count(&local_4e0,(key_type *)local_478);
          std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~unordered_map(&local_4e0);
          if (sVar5 == 0) {
            bindStr.field_2._12_4_ = 2;
          }
          else {
            DataVars::getSymbolTable_abi_cxx11_(&local_518,this->dataVars);
            pmVar6 = std::
                     unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                     ::at(&local_518,(key_type *)local_478);
            local_4a8 = *pmVar6;
            std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
            ::~unordered_map(&local_518);
            std::__cxx11::string::string((string *)local_540);
            DataBinds::getVarToNameInSimulator_abi_cxx11_(&local_578,this->dataBinds);
            sVar5 = std::
                    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::count(&local_578,(key_type *)local_478);
            std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~unordered_map(&local_578);
            if (sVar5 == 1) {
              DataBinds::getVarToNameInSimulator_abi_cxx11_(&local_5b0,this->dataBinds);
              pmVar7 = std::
                       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::at(&local_5b0,(key_type *)local_478);
              std::__cxx11::string::operator=((string *)local_540,(string *)pmVar7);
              std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~unordered_map(&local_5b0);
            }
            uVar8 = std::__cxx11::string::empty();
            if ((uVar8 & 1) == 0) {
              std::__cxx11::string::length();
              std::__cxx11::string::substr((ulong)((long)&setCommand.field_2 + 8),(ulong)local_540);
              std::__cxx11::string::operator=
                        ((string *)local_540,(string *)(setCommand.field_2._M_local_buf + 8));
              std::__cxx11::string::~string((string *)(setCommand.field_2._M_local_buf + 8));
              std::operator+(&local_650,"set ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_540);
              std::operator+(&local_630,&local_650," ");
              std::__cxx11::to_string(&local_670,local_4a8);
              std::operator+(&local_610,&local_630,&local_670);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_5f0,&local_610," \r\n");
              std::__cxx11::string::~string((string *)&local_610);
              std::__cxx11::string::~string((string *)&local_670);
              std::__cxx11::string::~string((string *)&local_630);
              std::__cxx11::string::~string((string *)&local_650);
              pcVar2 = buffer_ip + 0x18;
              memset(pcVar2,0,0x400);
              __src = (char *)std::__cxx11::string::c_str();
              strcpy(pcVar2,__src);
              __fd = serv_addr.sin_zero._4_4_;
              __n = strlen(pcVar2);
              send(__fd,pcVar2,__n,0);
              std::__cxx11::string::~string((string *)local_5f0);
              bindStr.field_2._12_4_ = 0;
            }
            else {
              bindStr.field_2._12_4_ = 2;
            }
            std::__cxx11::string::~string((string *)local_540);
          }
          std::__cxx11::string::~string((string *)local_478);
        } while( true );
      }
      perror("ERROR connecting");
    }
  }
  return;
}

Assistant:

void DataWriterClient::openClient() {
    int sockfd, portno;
    struct sockaddr_in serv_addr{};
    struct hostent *server;
    char buffer[1024];
    portno = this->port;

    // Create a socket point
    sockfd = socket(AF_INET, SOCK_STREAM, 0);
    if (sockfd < 0) {
        perror("ERROR opening socket");
        return;
    }
    char buffer_ip[26];
    strcpy(buffer_ip, ip.c_str());
    server = gethostbyname(buffer_ip);

    if (server == nullptr) {
        fprintf(stderr, "ERROR, no such host\n");
        return;
    }
    bzero((char *) &serv_addr, sizeof(serv_addr));
    serv_addr.sin_family = AF_INET;
    bcopy(server->h_addr, (char *) &serv_addr.sin_addr.s_addr, static_cast<size_t>(server->h_length));
    serv_addr.sin_port = htons(static_cast<uint16_t>(portno));

    // Now connect to the server
    if (connect(sockfd, (struct sockaddr *) &serv_addr, sizeof(serv_addr)) < 0) {
        perror("ERROR connecting");
        return;
    }

    while (true) {
        while (!dataVars->isChanged) {
            usleep(5000);
        }

        string varName = this->dataVars->getLastChanged().at(0);
        // delete first element

        this->dataVars->deleteFirstElementFromLastChanged();

        // Find the value of the var
        double varValue = 0;
        if (this->dataBinds->getVarToNameInSimulator().count(varName) >= 1) {
            varValue = this->dataVars->getSymbolTable().at(varName);
        } else {
            continue;
        }
        // Find the name of the var according to how it appears in the simulator
        string bindStr;
        if (this->dataBinds->getVarToNameInSimulator().count(varName) == 1) {
            bindStr = this->dataBinds->getVarToNameInSimulator().at(varName);
        }
        //local variable- not found in binds
        if (bindStr.empty()) {
            continue;
        }
        // Create an appropriate set command
        bindStr = bindStr.substr(1, bindStr.length() - 2);
        string setCommand = "set " + bindStr + " " + to_string(varValue) + " \r\n";
        bzero(buffer, 1024);

        strcpy(buffer, setCommand.c_str());
        send(sockfd, buffer, strlen(buffer), 0);
    }
}